

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aalcalc.cpp
# Opt level: O3

void __thiscall aalcalc::loadensemblemapping(aalcalc *this)

{
  vector<int,_std::allocator<int>_> *this_00;
  int *piVar1;
  pointer piVar2;
  pointer piVar3;
  int *piVar4;
  FILE *pFVar5;
  size_t sVar6;
  int *piVar7;
  mapped_type *pmVar8;
  vector<int,_std::allocator<int>_> *pvVar9;
  value_type_conflict *unaff_R15;
  float fVar10;
  Ensemble e;
  key_type kStack_4c;
  double dStack_48;
  aalcalc *paStack_40;
  vector<int,_std::allocator<int>_> *pvStack_38;
  code *pcStack_30;
  value_type_conflict local_24;
  int local_20;
  value_type_conflict local_1c;
  
  pcStack_30 = (code *)0x102ceb;
  pFVar5 = fopen("input/ensemble.bin","rb");
  if (pFVar5 != (FILE *)0x0) {
    if (this->ord_output_ == true) {
      pcStack_30 = (code *)0x102dff;
      loadensemblemapping();
    }
    else {
      local_24 = 0;
      pcStack_30 = (code *)0x102d22;
      std::vector<int,_std::allocator<int>_>::resize
                (&this->sidxtoensemble_,(long)this->samplesize_ + 1,&local_24);
      piVar2 = (this->sidxtoensemble_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar3 = (this->sidxtoensemble_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (piVar2 != piVar3) {
        pcStack_30 = (code *)0x102d4b;
        memset(piVar2,0,((long)piVar3 + (-4 - (long)piVar2) & 0xfffffffffffffffcU) + 4);
      }
      pcStack_30 = (code *)0x102d62;
      sVar6 = fread(&local_24,8,1,pFVar5);
      if (sVar6 != 0) {
        unaff_R15 = &local_24;
        do {
          (this->sidxtoensemble_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[local_24] = local_20;
          if (this->max_ensemble_id_ < local_20) {
            this->max_ensemble_id_ = local_20;
          }
          pcStack_30 = (code *)0x102d9c;
          sVar6 = fread(unaff_R15,8,1,pFVar5);
        } while (sVar6 != 0);
      }
      this_00 = &this->ensemblecount_;
      local_1c = 0;
      pcStack_30 = (code *)0x102dc2;
      pvVar9 = this_00;
      std::vector<int,_std::allocator<int>_>::resize
                (this_00,(long)this->max_ensemble_id_ + 1,&local_1c);
      piVar4 = (this->sidxtoensemble_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      piVar7 = (this->sidxtoensemble_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start + 1;
      if (piVar7 != piVar4) {
        piVar2 = (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        do {
          if ((long)*piVar7 == 0) {
            pcStack_30 = loadperiodtoweighting;
            loadensemblemapping();
            paStack_40 = this;
            pvStack_38 = this_00;
            pcStack_30 = (code *)unaff_R15;
            pFVar5 = fopen("input/periods.bin","rb");
            if (pFVar5 != (FILE *)0x0) {
              sVar6 = fread(&kStack_4c,0xc,1,pFVar5);
              if (sVar6 != 0) {
                do {
                  fVar10 = (float)dStack_48;
                  pmVar8 = std::
                           map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                           ::operator[]((map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                                         *)(pvVar9 + 0x11),&kStack_4c);
                  *pmVar8 = (double)fVar10;
                  sVar6 = fread(&kStack_4c,0xc,1,pFVar5);
                } while (sVar6 != 0);
              }
            }
            return;
          }
          piVar1 = piVar2 + *piVar7;
          *piVar1 = *piVar1 + 1;
          piVar7 = piVar7 + 1;
        } while (piVar7 != piVar4);
      }
    }
  }
  return;
}

Assistant:

void aalcalc::loadensemblemapping()
{
	FILE *fin = fopen(ENSEMBLE_FILE, "rb");
	if (fin == NULL) return;
	if (ord_output_ == true) {
		fprintf(stderr, "WARNING: ensembles not compatible with ORD format. Ignoring ensemble file.\n");
		return;
	}

	Ensemble e;
	sidxtoensemble_.resize(samplesize_ + 1, 0);
	std::fill(sidxtoensemble_.begin(), sidxtoensemble_.end(), 0);
	size_t i = fread(&e, sizeof(Ensemble), 1, fin);
	while (i != 0) {
		sidxtoensemble_[e.sidx] = e.ensemble_id;
		if (e.ensemble_id > max_ensemble_id_) {
			max_ensemble_id_ = e.ensemble_id;
		}

		i = fread(&e, sizeof(Ensemble), 1, fin);

	}

	// Check all sidx have ensemble IDs
	// Count how many sidx are associated with each ensemble ID
	ensemblecount_.resize(max_ensemble_id_ + 1, 0);
	for (std::vector<int>::const_iterator it = std::next(sidxtoensemble_.begin());
	     it != sidxtoensemble_.end(); it++) {
		if (*it == 0) {
			fprintf(stderr, "FATAL: All sidx must have associated ensemble IDs\n");
			exit(-1);
		}
		ensemblecount_[*it]++;
	}

}